

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<unsigned_int> * __thiscall
kj::Array<unsigned_int>::operator=(Array<unsigned_int> *this,Array<unsigned_int> *other)

{
  Array<unsigned_int> *other_local;
  Array<unsigned_int> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->size_ = other->size_;
  this->disposer = other->disposer;
  other->ptr = (uint *)0x0;
  other->size_ = 0;
  return this;
}

Assistant:

inline Array& operator=(Array&& other) {
    dispose();
    ptr = other.ptr;
    size_ = other.size_;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.size_ = 0;
    return *this;
  }